

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_init_copy(mp_int *a,mp_int *b)

{
  int iVar1;
  mp_int *in_RDI;
  int res;
  mp_int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mp_init(in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    iVar1 = mp_copy((mp_int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  }
  return iVar1;
}

Assistant:

int mp_init_copy (mp_int * a, mp_int * b)
{
  int     res;

  if ((res = mp_init (a)) != MP_OKAY) {
    return res;
  }
  return mp_copy (b, a);
}